

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.cpp
# Opt level: O1

bool vera::loadSTL(string *_filename,Mesh *_mesh)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  size_t sVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  byte bVar7;
  char *pcVar8;
  Mesh *__new_size;
  size_t sVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  vec3 n_1;
  double nd [3];
  double vd [3];
  char solid [80];
  Triangle tri_1;
  char header [80];
  char buf [4];
  vec3 n;
  uint num_tri;
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> triangles;
  char header_1 [80];
  unsigned_short att_count;
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_32f4;
  float local_32f0;
  float local_32ec;
  Mesh *local_32e8;
  int local_32dc;
  double local_32d8;
  double local_32d0;
  double local_32c8 [2];
  anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3 local_32b4;
  float local_32b0;
  float local_32ac;
  double local_32a8;
  double local_32a0;
  double local_3298;
  undefined1 *local_3290;
  undefined1 *local_3288 [2];
  undefined1 local_3278 [16];
  undefined1 *local_3268 [2];
  undefined1 local_3258 [16];
  undefined1 *local_3248 [2];
  undefined1 local_3238 [16];
  undefined1 *local_3228 [2];
  undefined1 local_3218 [16];
  undefined1 *local_3208 [2];
  undefined1 local_31f8 [16];
  undefined1 *local_31e8 [2];
  undefined1 local_31d8 [16];
  undefined1 *local_31c8 [2];
  undefined1 local_31b8 [16];
  undefined1 *local_31a8 [2];
  undefined1 local_3198 [16];
  undefined8 local_3188;
  undefined8 uStack_3180;
  undefined8 local_3178;
  undefined8 uStack_3170;
  undefined8 local_3168;
  undefined8 uStack_3160;
  undefined8 local_3158;
  undefined8 uStack_3150;
  undefined8 local_3148;
  undefined8 uStack_3140;
  Triangle local_3138;
  undefined1 local_3088 [80];
  undefined1 local_3038 [2048];
  undefined1 *local_2838 [2];
  undefined1 local_2828 [2032];
  uint local_2038 [512];
  vector<vera::Triangle,_std::allocator<vera::Triangle>_> local_1838 [85];
  char local_1038 [2048];
  vec3 local_838 [171];
  
  __stream = fopen((_filename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    loadSTL((vera *)_filename);
    bVar7 = 0;
    goto LAB_002c29c8;
  }
  local_3148 = 0;
  uStack_3140 = 0;
  local_3158 = 0;
  uStack_3150 = 0;
  local_3168 = 0;
  uStack_3160 = 0;
  local_3178 = 0;
  uStack_3170 = 0;
  local_3188 = 0;
  uStack_3180 = 0;
  sVar3 = fread(local_3088,1,0x50,__stream);
  if (sVar3 == 0x50) {
    local_32e8 = _mesh;
    __isoc99_sscanf(local_3088,"%79s",&local_3188);
    local_3038._0_8_ = local_3038 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3038,"solid","");
    iVar1 = std::__cxx11::string::compare((char *)local_3038);
    if ((undefined1 *)local_3038._0_8_ != local_3038 + 0x10) {
      operator_delete((void *)local_3038._0_8_);
    }
    if (iVar1 == 0) {
      sVar3 = fread(local_3038,1,4,__stream);
      if (sVar3 != 4) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"IOError: too short (3).",0x17);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
        goto LAB_002c29be;
      }
      uVar6 = local_3038._0_8_ & 0xffffffff;
      fseek(__stream,0,2);
      lVar4 = ftell(__stream);
      if ((long)(int)lVar4 == uVar6 * 0x32 + 0x54) goto LAB_002c1da0;
      fseek(__stream,0,0);
      pcVar8 = fgets(local_3038,0x800,__stream);
      if (pcVar8 != (char *)0x0) {
        local_3290 = local_3238;
        iVar1 = 0;
        do {
          Triangle::Triangle(&local_3138);
          iVar5 = __isoc99_fscanf(__stream,"%s %s %lg %lg %lg",local_1038,local_1838,&local_32d8,
                                  &local_32d0,local_32c8);
          local_32f4.x = (float)local_32d8;
          local_32f0 = (float)local_32d0;
          local_32ec = (float)local_32c8[0];
          local_2838[0] = local_2828;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_2838,"endsolid","");
          iVar2 = std::__cxx11::string::compare((char *)local_2838);
          if (local_2838[0] != local_2828) {
            operator_delete(local_2838[0]);
          }
          if (iVar2 == 0) {
            iVar5 = 4;
          }
          else {
            if (iVar5 == 5) {
              local_3248[0] = local_3238;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3248,"facet","");
              local_32dc = std::__cxx11::string::compare((char *)local_3248);
              bVar10 = local_32dc != 0;
              if (bVar10) {
                local_3268[0] = local_3258;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3268,"faced","");
                iVar2 = std::__cxx11::string::compare((char *)local_3268);
                if (iVar2 != 0) {
                  bVar10 = true;
                  bVar12 = false;
                  bVar11 = true;
                  goto LAB_002c2337;
                }
              }
              local_31a8[0] = local_3198;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_31a8,"normal","");
              iVar2 = std::__cxx11::string::compare((char *)local_31a8);
              bVar11 = iVar2 != 0;
              bVar12 = true;
            }
            else {
              bVar11 = true;
              bVar10 = false;
              bVar12 = false;
            }
LAB_002c2337:
            if ((bVar12) && (local_31a8[0] != local_3198)) {
              operator_delete(local_31a8[0]);
            }
            if ((bVar10) && (local_3268[0] != local_3258)) {
              operator_delete(local_3268[0]);
            }
            if ((iVar5 == 5) && (local_3248[0] != local_3238)) {
              operator_delete(local_3248[0]);
            }
            if (bVar11) {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"facet: ",7);
              sVar3 = strlen(local_1038);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,local_1038,sVar3);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
              std::ostream::put(-0x28);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"normal: ",8)
              ;
              sVar3 = strlen((char *)local_1838);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(char *)local_1838,sVar3);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
              std::ostream::put(-0x28);
              std::ostream::flush();
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"IOError: bad format (1).",0x18);
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
              std::ostream::put(-0x60);
              iVar5 = 2;
              std::ostream::flush();
            }
            else {
              local_32f4.x = (float)local_32d8;
              local_32f0 = (float)local_32d0;
              local_32ec = (float)local_32c8[0];
              Triangle::setNormals
                        (&local_3138,(vec3 *)&local_32f4,(vec3 *)&local_32f4,(vec3 *)&local_32f4);
              iVar5 = __isoc99_fscanf(__stream,"%s %s",local_2838,local_838);
              bVar12 = true;
              if (iVar5 == 2) {
                local_3288[0] = local_3278;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3288,"outer","");
                iVar2 = std::__cxx11::string::compare((char *)local_3288);
                if (iVar2 != 0) goto LAB_002c255d;
                local_31c8[0] = local_31b8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_31c8,"loop","");
                iVar2 = std::__cxx11::string::compare((char *)local_31c8);
                bVar12 = iVar2 != 0;
                bVar10 = true;
              }
              else {
LAB_002c255d:
                bVar10 = false;
              }
              if ((bVar10) && (local_31c8[0] != local_31b8)) {
                operator_delete(local_31c8[0]);
              }
              if ((iVar5 == 2) && (local_3288[0] != local_3278)) {
                operator_delete(local_3288[0]);
              }
              if (bVar12) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"IOError: bad format (2). ",0x19);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                std::ostream::put(-0x60);
                iVar5 = 2;
                std::ostream::flush();
              }
              else {
                sVar9 = 0;
                do {
                  iVar2 = __isoc99_fscanf(__stream,"%s",local_2038);
                  if (iVar2 == 1) {
                    local_31e8[0] = local_31d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_31e8,"endloop","");
                    iVar5 = std::__cxx11::string::compare((char *)local_31e8);
                    bVar12 = iVar5 == 0;
                    if (local_31e8[0] != local_31d8) {
                      operator_delete(local_31e8[0]);
                    }
                  }
                  else {
                    bVar12 = false;
                  }
                  iVar5 = 6;
                  if (!bVar12) {
                    if (iVar2 == 1) {
                      local_3208[0] = local_31f8;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)local_3208,"vertex","");
                      iVar5 = std::__cxx11::string::compare((char *)local_3208);
                      bVar12 = iVar5 == 0;
                      if (local_3208[0] != local_31f8) {
                        operator_delete(local_3208[0]);
                      }
                    }
                    else {
                      bVar12 = false;
                    }
                    if (bVar12) {
                      iVar5 = __isoc99_fscanf(__stream,"%lg %lg %lg",&local_32a8,&local_32a0,
                                              &local_3298);
                      if (iVar5 == 3) {
                        local_32b4.x = (float)local_32a8;
                        local_32b0 = (float)local_32a0;
                        local_32ac = (float)local_3298;
                        Triangle::setVertex(&local_3138,sVar9,(vec3 *)&local_32b4);
                        sVar9 = sVar9 + 1;
                        iVar5 = 0;
                      }
                      else {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"IOError: bad format (3).",0x18);
                        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                        std::ostream::put(-0x60);
                        iVar5 = 2;
                        std::ostream::flush();
                      }
                    }
                    else {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr,"IOError: bad format (4).",0x18);
                      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                      std::ostream::put(-0x60);
                      iVar5 = 2;
                      std::ostream::flush();
                    }
                  }
                } while (iVar5 == 0);
                if (iVar5 == 6) {
                  Mesh::addTriangle(local_32e8,&local_3138);
                  iVar5 = __isoc99_fscanf(__stream,"%s",local_2038);
                  bVar12 = true;
                  if (iVar5 == 1) {
                    local_3228[0] = local_3218;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_3228,"endfacet","");
                    iVar5 = std::__cxx11::string::compare((char *)local_3228);
                    bVar12 = iVar5 != 0;
                    if (local_3228[0] != local_3218) {
                      operator_delete(local_3228[0]);
                    }
                  }
                  iVar5 = 0;
                  if (bVar12) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cerr,"IOError: bad format (5).",0x18);
                    iVar5 = 2;
                    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
                  }
                }
              }
            }
          }
          Triangle::~Triangle(&local_3138);
        } while (iVar5 == 0);
        if (iVar5 == 4) {
          iVar5 = 7;
        }
        goto LAB_002c29af;
      }
      pcVar8 = "IOError: ascii too short (2).";
      lVar4 = 0x1d;
LAB_002c2976:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar8,lVar4);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
      std::ostream::put(-0x60);
      std::ostream::flush();
      iVar5 = 2;
    }
    else {
LAB_002c1da0:
      fseek(__stream,0,0);
      sVar3 = fread(local_1038,1,0x50,__stream);
      if (sVar3 != 0x50) {
        pcVar8 = "IOError: bad format (6).";
LAB_002c2971:
        lVar4 = 0x18;
        goto LAB_002c2976;
      }
      sVar3 = fread(local_2038,4,1,__stream);
      if (sVar3 != 1) {
        pcVar8 = "IOError: bad format (7).";
        goto LAB_002c2971;
      }
      local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1838[0].super__Vector_base<vera::Triangle,_std::allocator<vera::Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = (Mesh *)(ulong)local_2038[0];
      std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::resize
                (local_1838,(size_type)__new_size);
      if (0 < (int)local_2038[0]) {
        iVar5 = 0;
        iVar1 = 0;
        local_32e8 = __new_size;
        do {
          Triangle::Triangle((Triangle *)local_3038);
          sVar3 = fread((vec3 *)local_2838,4,3,__stream);
          if (sVar3 == 3) {
            Triangle::setNormals
                      ((Triangle *)local_3038,(vec3 *)local_2838,(vec3 *)local_2838,
                       (vec3 *)local_2838);
            sVar9 = 0;
            do {
              sVar3 = fread(local_838,4,3,__stream);
              if (sVar3 != 3) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"IOError: bad format (9).",0x18);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                std::ostream::put(-0x60);
                iVar2 = 2;
                std::ostream::flush();
                __new_size = local_32e8;
                goto LAB_002c1f1c;
              }
              Triangle::setVertex((Triangle *)local_3038,sVar9,local_838);
              sVar9 = sVar9 + 1;
            } while (sVar9 != 3);
            iVar2 = 0xb;
            __new_size = local_32e8;
LAB_002c1f1c:
            local_32e8 = __new_size;
            if (iVar2 == 0xb) {
              sVar3 = fread(local_838,2,1,__stream);
              iVar2 = 0;
              if (sVar3 != 1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"IOError: bad format (10).",0x19);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
                std::ostream::put(-0x60);
                iVar2 = 2;
                std::ostream::flush();
              }
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"IOError: bad format (8).",0x18);
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
            std::ostream::put(-0x60);
            iVar2 = 2;
            std::ostream::flush();
          }
          Triangle::~Triangle((Triangle *)local_3038);
          if (iVar2 != 0) goto LAB_002c1ffe;
          iVar5 = iVar5 + 1;
        } while (iVar5 != (int)__new_size);
      }
      iVar2 = 8;
LAB_002c1ffe:
      iVar5 = 7;
      if (iVar2 != 8) {
        iVar5 = iVar2;
      }
      std::vector<vera::Triangle,_std::allocator<vera::Triangle>_>::~vector(local_1838);
    }
LAB_002c29af:
    bVar7 = (byte)iVar1;
    if (iVar5 == 2) goto LAB_002c29be;
    if (iVar5 != 7) goto LAB_002c29c8;
    bVar7 = 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"IOError: too short (1).",0x17);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x60);
    std::ostream::put(-0x60);
    std::ostream::flush();
LAB_002c29be:
    bVar7 = 0;
  }
  fclose(__stream);
LAB_002c29c8:
  return (bool)(bVar7 & 1);
}

Assistant:

bool loadSTL( const std::string& _filename, Mesh& _mesh ) {
    FILE * stl_file = fopen(_filename.c_str(),"rb");
    if (NULL == stl_file) {
        fprintf(stderr,"IOError: %s could not be opened...\n", _filename.c_str());
        return false;
    }

     // Specifically 80 character header
    char header[80];
    char solid[80] = {0};
    bool is_ascii = true;
    if (fread(header, 1, 80, stl_file) != 80) {
        std::cerr << "IOError: too short (1)." << std::endl;
        goto close_false;
    }
    sscanf(header, "%79s", solid);
  
    if ( std::string("solid") != solid) 
        is_ascii = false;
    else {
        // might still be binary
        char buf[4];
        if ( fread(buf, 1, 4, stl_file) != 4) {
            std::cerr << "IOError: too short (3)." << std::endl;
            goto close_false;
        }
    
        size_t num_faces = *reinterpret_cast<unsigned int*>(buf);
        fseek(stl_file,0,SEEK_END);
        int file_size = ftell(stl_file);
        if (file_size == 80 + 4 + (4*12 + 2) * num_faces) is_ascii = false;
        else is_ascii = true;
    }

    if (is_ascii) {
        // Rewind to end of header
        //stl_file = fopen(filename.c_str(),"r");
        //stl_file = freopen(NULL,"r",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        if (NULL == stl_file) {
            fprintf(stderr,"IOError: stl file could not be reopened as ascii ...\n");
            return false;
        }
        // Read 80 header
        // Eat file name

        char name[LINE_MAX];
        if ( NULL == fgets(name, LINE_MAX, stl_file)) {
            std::cerr << "IOError: ascii too short (2)." << std::endl;
            goto close_false;
        }

        // ascii
        while(true) {
            int ret;
            char facet[LINE_MAX];
            char normal[LINE_MAX];

            Triangle tri;
            glm::vec3 n;

            double nd[3];
            ret = fscanf(stl_file,"%s %s %lg %lg %lg", facet, normal, nd, nd+1, nd+2);
            n.x = nd[0];
            n.y = nd[1];
            n.z = nd[2];

            if (std::string("endsolid") == facet)
                break;
            
            if (ret != 5 || 
                !(  std::string("facet") == facet || 
                    std::string("faced") == facet) ||
                    std::string("normal") != normal) {
                std::cout << "facet: " << facet << std::endl;
                std::cout << "normal: " <<normal << std::endl;
                std::cerr << "IOError: bad format (1)." << std::endl;
                goto close_false;
            }
            // copy casts to Type
            n.x = nd[0]; 
            n.y = nd[1];
            n.z = nd[2];
            tri.setNormals(n, n, n);
            char outer[LINE_MAX], loop[LINE_MAX];
            ret = fscanf(stl_file,"%s %s",outer,loop);
            if (ret != 2 || std::string("outer") != outer || std::string("loop") != loop) {
                std::cerr << "IOError: bad format (2). " << std::endl;
                goto close_false;
            }
            
            size_t index = 0;
            while(true) {
                char word[LINE_MAX];
                int ret = fscanf(stl_file, "%s", word);
                if (ret == 1 && std::string("endloop") == word)
                    break;
                else if (ret == 1 && std::string("vertex") == word) {
                    glm::vec3 v;
                    double vd[3];
                    int ret = fscanf(stl_file, "%lg %lg %lg", vd, vd+1, vd+2);
                    if (ret != 3) {
                        std::cerr << "IOError: bad format (3)." << std::endl;
                        goto close_false;
                    }
                    tri.setVertex(index, glm::vec3(vd[0], vd[1], vd[2]));
                    index++;
                }
                else {
                    std::cerr << "IOError: bad format (4)." << std::endl;
                    goto close_false;
                }
            }
            _mesh.addTriangle(tri);

            char endfacet[LINE_MAX];
            ret = fscanf(stl_file,"%s",endfacet);
            if (ret != 1 || std::string("endfacet") != endfacet) {
                std::cerr << "IOError: bad format (5)." << std::endl;
                goto close_false;
            }
        }
        // read endfacet
        goto close_true;
    }
    else {
        // Binary
        // stl_file = freopen(NULL,"rb",stl_file);
        fseek(stl_file, 0, SEEK_SET);
        // Read 80 header
        char header[80];
        if (fread(header, sizeof(char), 80, stl_file) != 80) {
            std::cerr << "IOError: bad format (6)." << std::endl;
            goto close_false;
        }
        // Read number of triangles
        unsigned int num_tri;
        if (fread(&num_tri, sizeof(unsigned int), 1, stl_file) != 1) {
            std::cerr << "IOError: bad format (7)." << std::endl;
            goto close_false;
        }

        std::vector<Triangle> triangles;
        triangles.resize(num_tri);
        for(int t = 0; t < (int)num_tri; t++) {
            Triangle tri;

            // Read normal
            glm::vec3 n;
            if (fread(&n.x, sizeof(float), 3, stl_file) != 3) {
                std::cerr << "IOError: bad format (8)." << std::endl;
                goto close_false;
            }
            tri.setNormals(n, n, n);

            // Read each vertex
            for (size_t c = 0; c < 3; c++) {
                glm::vec3 v;
                if (fread (&v.x, sizeof(float), 3, stl_file) != 3) {
                    std::cerr << "IOError: bad format (9)." << std::endl;
                    goto close_false;
                }
                tri.setVertex(c, v);
            }
            
            // Read attribute size
            unsigned short att_count;
            if (fread(&att_count, sizeof(unsigned short), 1, stl_file) != 1) {
                std::cerr << "IOError: bad format (10)." << std::endl;
                goto close_false;
            }
        }
        goto close_true;
    }

    close_false:
        fclose(stl_file);
        return false;
    close_true:
        fclose(stl_file);
        return true;
}